

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computePrimal(HEkk *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  value_type vVar6;
  HEkk *in_RDI;
  HighsInt iCol;
  HighsInt i_1;
  double local_primal_col_density;
  HighsInt i;
  HVector primal_col;
  HighsInt num_col;
  HighsInt num_row;
  HighsTimerClock *in_stack_fffffffffffffee8;
  HVectorBase<double> *in_stack_fffffffffffffef0;
  HVector *in_stack_fffffffffffffef8;
  HighsSimplexAnalysis *in_stack_ffffffffffffff00;
  int local_dc;
  int local_d0;
  int local_bc;
  pointer in_stack_ffffffffffffff68;
  HighsInt in_stack_ffffffffffffff74;
  HVector *in_stack_ffffffffffffff78;
  HighsSparseMatrix *in_stack_ffffffffffffff80;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff00,(HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffef8);
  iVar1 = (in_RDI->lp_).num_row_;
  iVar2 = (in_RDI->lp_).num_col_;
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffef0);
  HVectorBase<double>::setup
            ((HVectorBase<double> *)in_stack_ffffffffffffff00,
             (HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  HVectorBase<double>::clear((HVectorBase<double> *)in_RDI);
  for (local_d0 = 0; local_d0 < iVar2 + iVar1; local_d0 = local_d0 + 1) {
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&(in_RDI->basis_).nonbasicFlag_,(long)local_d0);
    if (*pvVar3 != '\0') {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->info_).workValue_,(long)local_d0);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        in_stack_ffffffffffffff00 = (HighsSimplexAnalysis *)&(in_RDI->lp_).a_matrix_;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(in_RDI->info_).workValue_,(long)local_d0);
        HighsSparseMatrix::collectAj
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                   (double)in_stack_ffffffffffffff68);
      }
    }
  }
  if (local_bc != 0) {
    HSimplexNla::ftran((HSimplexNla *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       (double)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    updateOperationResultDensity
              (in_RDI,(double)local_bc / (double)iVar1,&(in_RDI->info_).primal_col_density);
  }
  for (local_dc = 0; local_dc < iVar1; local_dc = local_dc + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(in_RDI->basis_).basicIndex_,(long)local_dc);
    iVar2 = *pvVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff60,
                        (long)local_dc);
    vVar6 = -*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(in_RDI->info_).baseValue_,(long)local_dc);
    *pvVar4 = vVar6;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(in_RDI->info_).workLower_,(long)iVar2);
    in_stack_fffffffffffffef0 = (HVectorBase<double> *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(in_RDI->info_).baseLower_,(long)local_dc);
    *pvVar4 = (value_type)in_stack_fffffffffffffef0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(in_RDI->info_).workUpper_,(long)iVar2);
    in_stack_fffffffffffffef8 = (HVector *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(in_RDI->info_).baseUpper_,(long)local_dc);
    *pvVar4 = (value_type)in_stack_fffffffffffffef8;
  }
  (in_RDI->info_).num_primal_infeasibilities = -1;
  (in_RDI->info_).max_primal_infeasibility = INFINITY;
  (in_RDI->info_).sum_primal_infeasibilities = INFINITY;
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff00,(HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffef8);
  HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void HEkk::computePrimal() {
  analysis_.simplexTimerStart(ComputePrimalClock);
  const HighsInt num_row = lp_.num_row_;
  const HighsInt num_col = lp_.num_col_;
  // Setup a local buffer for the values of basic variables
  HVector primal_col;
  primal_col.setup(num_row);
  primal_col.clear();
  for (HighsInt i = 0; i < num_col + num_row; i++) {
    if (basis_.nonbasicFlag_[i] && info_.workValue_[i] != 0) {
      lp_.a_matrix_.collectAj(primal_col, i, info_.workValue_[i]);
    }
  }
  // It's possible that the buffer has no nonzeros, so performing
  // FTRAN is unnecessary. Not much of a saving, but the zero density
  // looks odd in the analysis!
  if (primal_col.count) {
    simplex_nla_.ftran(primal_col, info_.primal_col_density,
                       analysis_.pointer_serial_factor_clocks);
    const double local_primal_col_density = (double)primal_col.count / num_row;
    updateOperationResultDensity(local_primal_col_density,
                                 info_.primal_col_density);
  }
  for (HighsInt i = 0; i < num_row; i++) {
    HighsInt iCol = basis_.basicIndex_[i];
    info_.baseValue_[i] = -primal_col.array[i];
    info_.baseLower_[i] = info_.workLower_[iCol];
    info_.baseUpper_[i] = info_.workUpper_[iCol];
  }
  // Indicate that the primal infeasibility information isn't known
  info_.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;

  analysis_.simplexTimerStop(ComputePrimalClock);
}